

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubTransport_StartWorkerThread
          (TRANSPORT_HANDLE transportHandle,IOTHUB_CLIENT_CORE_HANDLE clientHandle,
          IOTHUB_CLIENT_MULTIPLEXED_DO_WORK muxDoWork)

{
  THREAD_HANDLE *threadHandle;
  THREADAPI_RESULT TVar1;
  LOCK_RESULT LVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  LOGGER_LOG p_Var6;
  IOTHUB_CLIENT_RESULT IVar7;
  char *pcVar8;
  TRANSPORT_HANDLE_DATA *transportData;
  IOTHUB_CLIENT_CORE_HANDLE local_20;
  
  if (clientHandle == (IOTHUB_CLIENT_CORE_HANDLE)0x0 || transportHandle == (TRANSPORT_HANDLE)0x0) {
    return IOTHUB_CLIENT_INVALID_ARG;
  }
  if (transportHandle->clientDoWork == (IOTHUB_CLIENT_MULTIPLEXED_DO_WORK)0x0) {
    transportHandle->clientDoWork = muxDoWork;
  }
  threadHandle = &transportHandle->workerThreadHandle;
  local_20 = clientHandle;
  if (transportHandle->workerThreadHandle == (THREAD_HANDLE)0x0) {
    transportHandle->stopThread = 0;
    TVar1 = ThreadAPI_Create(threadHandle,transport_worker_thread,transportHandle);
    if (TVar1 != THREADAPI_OK) {
      *threadHandle = (THREAD_HANDLE)0x0;
    }
  }
  IVar7 = IOTHUB_CLIENT_ERROR;
  if (*threadHandle != (THREAD_HANDLE)0x0) {
    LVar2 = Lock(transportHandle->clientsLockHandle);
    if (LVar2 == LOCK_OK) {
      sVar4 = VECTOR_size(transportHandle->clients);
      if (((sVar4 == 0) ||
          (pvVar5 = VECTOR_find_if(transportHandle->clients,find_by_handle,local_20),
          pvVar5 == (void *)0x0)) &&
         (iVar3 = VECTOR_push_back(transportHandle->clients,&local_20,1), iVar3 != 0)) {
        p_Var6 = xlogging_get_log_function();
        IVar7 = IOTHUB_CLIENT_ERROR;
        if (p_Var6 != (LOGGER_LOG)0x0) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                    ,"start_worker_if_needed",0xe5,1,
                    "Failed adding device to list (VECTOR_push_back failed)");
        }
      }
      else {
        IVar7 = IOTHUB_CLIENT_OK;
      }
      LVar2 = Unlock(transportHandle->clientsLockHandle);
      if ((LVar2 == LOCK_OK) || (p_Var6 = xlogging_get_log_function(), p_Var6 == (LOGGER_LOG)0x0))
      goto LAB_001251b6;
      pcVar8 = "failed to unlock on start_worker_if_needed";
      iVar3 = 0xf4;
    }
    else {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_001251b6;
      pcVar8 = "failed to lock for start_worker_if_needed";
      iVar3 = 0xdb;
    }
    (*p_Var6)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
              ,"start_worker_if_needed",iVar3,1,pcVar8);
  }
LAB_001251b6:
  if (IVar7 == IOTHUB_CLIENT_OK) {
    IVar7 = IOTHUB_CLIENT_OK;
  }
  else {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                ,"IoTHubTransport_StartWorkerThread",0x188,1,"Unable to start thread safely");
    }
  }
  return IVar7;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_StartWorkerThread(TRANSPORT_HANDLE transportHandle, IOTHUB_CLIENT_CORE_HANDLE clientHandle, IOTHUB_CLIENT_MULTIPLEXED_DO_WORK muxDoWork)
{
    IOTHUB_CLIENT_RESULT result;
    if (transportHandle == NULL || clientHandle == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        TRANSPORT_HANDLE_DATA * transportData = (TRANSPORT_HANDLE_DATA*)transportHandle;

        if (transportData->clientDoWork == NULL)
        {
            transportData->clientDoWork = muxDoWork;
        }

        if ((result = start_worker_if_needed(transportData, clientHandle)) != IOTHUB_CLIENT_OK)
        {
            LogError("Unable to start thread safely");
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }
    return result;
}